

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O0

int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *pNtk)

{
  Nm_Man_t *pNVar1;
  Flow_Data_t *pFVar2;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  Vec_Ptr_t *vMove;
  Vec_Ptr_t *vBoxIns;
  Vec_Ptr_t *vFreeRegs;
  Abc_Obj_t *pBi;
  Abc_Obj_t *pBo;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pReg;
  Abc_Obj_t *pObj;
  int unmoved;
  int cut;
  int j;
  int i;
  Abc_Ntk_t *pNtk_local;
  
  pObj._4_4_ = 0;
  pObj._0_4_ = 0;
  iVar3 = Abc_NtkLatchNum(pNtk);
  p = Vec_PtrAlloc(iVar3);
  iVar3 = Abc_NtkLatchNum(pNtk);
  p_00 = Vec_PtrAlloc(iVar3);
  p_01 = Vec_PtrAlloc(100);
  for (cut = 0; iVar3 = Vec_PtrSize(pNtk->vBoxes), cut < iVar3; cut = cut + 1) {
    pAVar5 = Abc_NtkBox(pNtk,cut);
    iVar3 = Abc_ObjIsLatch(pAVar5);
    if (iVar3 != 0) {
      pAVar7 = Abc_ObjFanout0(pAVar5);
      pAVar8 = Abc_ObjFanin0(pAVar5);
      iVar3 = Abc_ObjIsBo(pAVar7);
      if ((iVar3 == 0) || (iVar3 = Abc_ObjIsBi(pAVar8), iVar3 == 0)) {
        __assert_fail("Abc_ObjIsBo(pBo) && Abc_ObjIsBi(pBi)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                      ,0x338,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
      }
      Vec_PtrPush(p_00,pAVar8);
      Abc_FlowRetime_CopyInitState(pAVar5,pAVar7);
      Vec_PtrPush(p,pAVar5);
      pFVar2 = pManMR->pDataArray;
      uVar4 = Abc_ObjId(pAVar7);
      *(ushort *)(pFVar2 + uVar4) = *(ushort *)(pFVar2 + uVar4) | 8;
      Abc_ObjPatchFanin(pAVar7,pAVar5,pAVar8);
      Abc_ObjRemoveFanins(pAVar5);
      pNVar1 = pNtk->pManName;
      uVar4 = Abc_ObjId(pAVar5);
      pcVar6 = Nm_ManFindNameById(pNVar1,uVar4);
      if (pcVar6 != (char *)0x0) {
        pNVar1 = pNtk->pManName;
        uVar4 = Abc_ObjId(pAVar5);
        Nm_ManDeleteIdName(pNVar1,uVar4);
      }
    }
  }
  cut = 0;
  do {
    iVar3 = Vec_PtrSize(pNtk->vObjs);
    if (iVar3 <= cut) {
      Abc_FlowRetime_VerifyPathLatencies(pNtk);
      while (iVar3 = Vec_PtrSize(p), iVar3 != 0) {
        pAVar5 = (Abc_Obj_t *)Vec_PtrPop(p);
        Abc_NtkDeleteObj(pAVar5);
      }
      Abc_FlowRetime_UpdateLags();
      Abc_FlowRetime_InitState(pNtk);
      Abc_FlowRetime_FixLatchBoxes(pNtk,p_00);
      Vec_PtrFree(p);
      Vec_PtrFree(p_01);
      Vec_PtrFree(p_00);
      if (pManMR->fVerbose != 0) {
        printf("\t\tmin-cut = %d (unmoved = %d)\n",(ulong)pObj._4_4_,(ulong)(uint)pObj);
      }
      return pObj._4_4_;
    }
    pAVar5 = Abc_NtkObj(pNtk,cut);
    if (((pAVar5 != (Abc_Obj_t *)0x0) && (iVar3 = Abc_ObjIsLatch(pAVar5), iVar3 == 0)) &&
       (pFVar2 = pManMR->pDataArray, uVar4 = Abc_ObjId(pAVar5),
       (undefined1  [24])((undefined1  [24])pFVar2[uVar4] & (undefined1  [24])0x100) ==
       (undefined1  [24])0x0)) {
      if (((pManMR->fIsForward != 0) &&
          (pFVar2 = pManMR->pDataArray, uVar4 = Abc_ObjId(pAVar5),
          (undefined1  [24])((undefined1  [24])pFVar2[uVar4] & (undefined1  [24])0x1) !=
          (undefined1  [24])0x0)) &&
         (pFVar2 = pManMR->pDataArray, uVar4 = Abc_ObjId(pAVar5),
         (undefined1  [24])((undefined1  [24])pFVar2[uVar4] & (undefined1  [24])0x2) ==
         (undefined1  [24])0x0)) {
        __assert_fail("!pManMR->fIsForward || !FTEST(pObj, VISITED_E) || FTEST(pObj, VISITED_R)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                      ,0x351,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
      }
      pFVar2 = pManMR->pDataArray;
      uVar4 = Abc_ObjId(pAVar5);
      if (((undefined1  [24])((undefined1  [24])pFVar2[uVar4] & (undefined1  [24])0x2) !=
           (undefined1  [24])0x0) &&
         (pFVar2 = pManMR->pDataArray, uVar4 = Abc_ObjId(pAVar5),
         (undefined1  [24])((undefined1  [24])pFVar2[uVar4] & (undefined1  [24])0x1) ==
         (undefined1  [24])0x0)) {
        pFVar2 = pManMR->pDataArray;
        uVar4 = Abc_ObjId(pAVar5);
        if ((undefined1  [24])((undefined1  [24])pFVar2[uVar4] & (undefined1  [24])0x4) ==
            (undefined1  [24])0x0) {
          __assert_fail("FTEST(pObj, FLOW)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x353,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
        }
        pObj._4_4_ = pObj._4_4_ + 1;
        if (((pManMR->fIsForward != 0) && (iVar3 = Abc_ObjIsBo(pAVar5), iVar3 != 0)) ||
           ((pManMR->fIsForward == 0 && (iVar3 = Abc_ObjIsBi(pAVar5), iVar3 != 0)))) {
          pObj._0_4_ = (uint)pObj + 1;
        }
        for (unmoved = 0; iVar3 = Abc_ObjFanoutNum(pAVar5), unmoved < iVar3; unmoved = unmoved + 1)
        {
          pAVar7 = Abc_ObjFanout(pAVar5,unmoved);
          iVar3 = Abc_FlowRetime_IsAcrossCut(pAVar5,pAVar7);
          if (iVar3 != 0) {
            Vec_PtrPush(p_01,pAVar7);
          }
        }
        iVar3 = Vec_PtrSize(p_01);
        if (iVar3 == 0) {
          print_node(pAVar5);
        }
        iVar3 = Vec_PtrSize(p_01);
        if (iVar3 < 1) {
          __assert_fail("Vec_PtrSize(vMove) > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x364,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
        }
        iVar3 = Vec_PtrSize(p);
        if (iVar3 == 0) {
          __assert_fail("Vec_PtrSize( vFreeRegs )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x367,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
        }
        pAVar7 = (Abc_Obj_t *)Vec_PtrPop(p);
        Abc_ObjAddFanin(pAVar7,pAVar5);
        while (iVar3 = Vec_PtrSize(p_01), iVar3 != 0) {
          pAVar8 = (Abc_Obj_t *)Vec_PtrPop(p_01);
          Abc_ObjPatchFanin(pAVar8,pAVar5,pAVar7);
          iVar3 = Abc_ObjIsBi(pAVar8);
          if ((iVar3 != 0) && (iVar3 = Abc_ObjFaninNum(pAVar8), iVar3 != 1)) {
            __assert_fail("Abc_ObjFaninNum(pNext) == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                          ,0x36e,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
          }
        }
      }
    }
    cut = cut + 1;
  } while( true );
}

Assistant:

int
Abc_FlowRetime_ImplementCut( Abc_Ntk_t * pNtk ) {
  int i, j, cut = 0, unmoved = 0;
  Abc_Obj_t *pObj, *pReg, *pNext, *pBo = NULL, *pBi = NULL;
  Vec_Ptr_t *vFreeRegs = Vec_PtrAlloc( Abc_NtkLatchNum(pNtk) );
  Vec_Ptr_t *vBoxIns = Vec_PtrAlloc( Abc_NtkLatchNum(pNtk) );
  Vec_Ptr_t *vMove = Vec_PtrAlloc( 100 );

  // remove latches from netlist
  Abc_NtkForEachLatch( pNtk, pObj, i ) {
    pBo = Abc_ObjFanout0(pObj);
    pBi = Abc_ObjFanin0(pObj);
    assert(Abc_ObjIsBo(pBo) && Abc_ObjIsBi(pBi));
    Vec_PtrPush( vBoxIns, pBi );

    // copy initial state values to BO
    Abc_FlowRetime_CopyInitState( pObj, pBo );

    // re-use latch elsewhere
    Vec_PtrPush( vFreeRegs, pObj );
    FSET(pBo, CROSS_BOUNDARY);

    // cut out of netlist
    Abc_ObjPatchFanin( pBo, pObj, pBi );
    Abc_ObjRemoveFanins( pObj );

    // free name
    if (Nm_ManFindNameById(pNtk->pManName, Abc_ObjId(pObj)))
      Nm_ManDeleteIdName( pNtk->pManName, Abc_ObjId(pObj));
  }

  // insert latches into netlist
  Abc_NtkForEachObj( pNtk, pObj, i ) {
    if (Abc_ObjIsLatch( pObj )) continue;
    if (FTEST(pObj, BIAS_NODE)) continue;
    
    // a latch is required on every node that lies across the min-cit
    assert(!pManMR->fIsForward || !FTEST(pObj, VISITED_E) || FTEST(pObj, VISITED_R));
    if (FTEST(pObj, VISITED_R) && !FTEST(pObj, VISITED_E)) {
      assert(FTEST(pObj, FLOW));

      // count size of cut
      cut++;
      if ((pManMR->fIsForward && Abc_ObjIsBo(pObj)) || 
          (!pManMR->fIsForward && Abc_ObjIsBi(pObj)))
        unmoved++;
      
      // only insert latch between fanouts that lie across min-cut
      // some fanout paths may be cut at deeper points
      Abc_ObjForEachFanout( pObj, pNext, j )
        if (Abc_FlowRetime_IsAcrossCut( pObj, pNext ))
          Vec_PtrPush(vMove, pNext);

      // check that move-set is non-zero
      if (Vec_PtrSize(vMove) == 0)
        print_node(pObj);
      assert(Vec_PtrSize(vMove) > 0);
      
      // insert one of re-useable registers
      assert(Vec_PtrSize( vFreeRegs ));
      pReg = (Abc_Obj_t *)Vec_PtrPop( vFreeRegs );
      
      Abc_ObjAddFanin(pReg, pObj);
      while(Vec_PtrSize( vMove )) {
        pNext = (Abc_Obj_t *)Vec_PtrPop( vMove );
        Abc_ObjPatchFanin( pNext, pObj, pReg );
        if (Abc_ObjIsBi(pNext)) assert(Abc_ObjFaninNum(pNext) == 1);

      }
      // APH: broken by bias nodes  if (Abc_ObjIsBi(pObj)) assert(Abc_ObjFaninNum(pObj) == 1);
    }
  }

#if defined(DEBUG_CHECK)        
  Abc_FlowRetime_VerifyPathLatencies( pNtk );
#endif

  // delete remaining latches
  while(Vec_PtrSize( vFreeRegs )) {
    pReg = (Abc_Obj_t *)Vec_PtrPop( vFreeRegs );
    Abc_NtkDeleteObj( pReg );
  }
  
  // update initial states
  Abc_FlowRetime_UpdateLags( );
  Abc_FlowRetime_InitState( pNtk );

  // restore latch boxes
  Abc_FlowRetime_FixLatchBoxes( pNtk, vBoxIns );

  Vec_PtrFree( vFreeRegs );
  Vec_PtrFree( vMove );
  Vec_PtrFree( vBoxIns );

  vprintf("\t\tmin-cut = %d (unmoved = %d)\n", cut, unmoved);
  return cut;
}